

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O1

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
::
calculate_origin_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>,boost::array<long,2ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
           *this,array<long,_2UL> *stride_list,array<unsigned_long,_2UL> *extent_list,
          general_storage_order<2UL> *storage,array<long,_2UL> *index_base_list)

{
  undefined1 auVar1 [16];
  byte bVar2;
  size_type n;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  n = 1;
  lVar3 = 0;
  do {
    bVar2 = (byte)n & (storage->ascending_).elems[lVar3];
    n = (size_type)bVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  if (bVar2 == 0) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if ((storage->ascending_).elems[lVar3] == false) {
        lVar4 = lVar4 - (extent_list->elems[lVar3] - 1) * stride_list->elems[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  else {
    lVar4 = 0;
  }
  auVar5 = vpmullq_avx512vl(*(undefined1 (*) [16])index_base_list->elems,
                            *(undefined1 (*) [16])stride_list->elems);
  auVar1 = vpsubq_avx((undefined1  [16])0x0,auVar5);
  auVar1 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpsubq_avx(auVar1,auVar5);
  return auVar1._0_8_ + lVar4;
}

Assistant:

index
  calculate_origin_offset(const StrideList& stride_list,
                          const ExtentList& extent_list,
                          const general_storage_order<NumDims>& storage,
                          const BaseList& index_base_list)
  {
    return
      calculate_descending_dimension_offset(stride_list,extent_list,
                                            storage) +
      calculate_indexing_offset(stride_list,index_base_list);
  }